

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

parser_error parse_entry_combine(parser *p)

{
  int iVar1;
  parser_error pVar2;
  long *plVar3;
  char *name;
  
  plVar3 = (long *)parser_priv(p);
  if (plVar3 == (long *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = parser_getstr(p,"combine");
    iVar1 = ui_entry_combiner_lookup(name);
    *(int *)(*plVar3 + 0x1ac) = iVar1;
    pVar2 = PARSE_ERROR_INVALID_VALUE;
    if (iVar1 != 0) {
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_entry_combine(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	const char *name;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getstr(p, "combine");
	embryo->entry->combiner_index = ui_entry_combiner_lookup(name);
	return (embryo->entry->combiner_index) ?
		PARSE_ERROR_NONE : PARSE_ERROR_INVALID_VALUE;
}